

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O3

shared_ptr<const_CBlock> __thiscall
validation_block_tests::MinerTestingSetup::BadBlock(MinerTestingSetup *this,uint256 *prev_hash)

{
  long lVar1;
  TestingSetup *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_FS_OFFSET;
  shared_ptr<CBlock> pblock_00;
  shared_ptr<const_CBlock> sVar4;
  CMutableTransaction coinbase_spend;
  shared_ptr<CBlock> pblock;
  CTransactionRef tx;
  long local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  int local_b4;
  CMutableTransaction local_b0;
  undefined1 local_78 [16];
  undefined1 local_68 [28];
  uint uStack_4c;
  undefined1 local_48 [8];
  _Head_base<0UL,_CConnman_*,_false> _Stack_40;
  _Head_base<0UL,_CTxMemPool_*,_false> local_38;
  _Head_base<0UL,_const_NetGroupManager_*,_false> _Stack_30;
  uint32_t local_28;
  _Head_base<0UL,_PeerManager_*,_false> local_20;
  
  local_20._M_head_impl =
       *(PeerManager **)
        &((__uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_> *)(in_FS_OFFSET + 0x28))
         ->_M_t;
  Block((MinerTestingSetup *)local_78,prev_hash);
  CMutableTransaction::CMutableTransaction(&local_b0);
  lVar1 = **(long **)(local_78._0_8_ + 0x50);
  local_48 = *(undefined1 (*) [8])(lVar1 + 0x39);
  _Stack_40._M_head_impl = *(CConnman **)(lVar1 + 0x41);
  local_38._M_head_impl = *(CTxMemPool **)(lVar1 + 0x49);
  _Stack_30._M_head_impl = *(NetGroupManager **)(lVar1 + 0x51);
  local_28 = 0;
  local_68._16_8_ = (Init *)0x0;
  stack0xffffffffffffffb0 = (ECC_Context *)0x0;
  local_68._0_8_ = (Context *)0x0;
  local_68._8_8_ = (ECC_Context *)0x0;
  local_b4 = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&local_b0,(COutPoint *)local_48,
             (CScript *)local_68,&local_b4);
  if (0x1c < uStack_4c) {
    free((void *)local_68._0_8_);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
            (&local_b0.vout,*(value_type **)(**(long **)(local_78._0_8_ + 0x50) + 0x18));
  local_48 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_40,(CTransaction **)local_48,
             (allocator<CTransaction> *)local_68,&local_b0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)(local_78._0_8_ + 0x50),(value_type *)local_48);
  local_c8 = local_78._0_8_;
  local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
    }
  }
  pblock_00.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_c8;
  pblock_00.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)prev_hash;
  FinalizeBlock((MinerTestingSetup *)local_68,pblock_00);
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  pTVar2 = &(this->super_RegTestingSetup).super_TestingSetup;
  (pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_flag =
       (atomic<bool>)local_68[0];
  *(undefined3 *)&(pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.field_0x1 =
       local_68._1_3_;
  (pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_pipe_r =
       (TokenPipeEnd)local_68._4_4_;
  *(undefined8 *)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .m_interrupt.m_pipe_w = local_68._8_8_;
  if (_Stack_40._M_head_impl != (CConnman *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_head_impl);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b0.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b0.vin);
  _Var3._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (((_Head_base<0UL,_PeerManager_*,_false> *)(in_FS_OFFSET + 0x28))->_M_head_impl ==
      local_20._M_head_impl) {
    sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<const_CBlock>)
           sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CBlock> MinerTestingSetup::BadBlock(const uint256& prev_hash)
{
    auto pblock = Block(prev_hash);

    CMutableTransaction coinbase_spend;
    coinbase_spend.vin.emplace_back(COutPoint(pblock->vtx[0]->GetHash(), 0), CScript(), 0);
    coinbase_spend.vout.push_back(pblock->vtx[0]->vout[0]);

    CTransactionRef tx = MakeTransactionRef(coinbase_spend);
    pblock->vtx.push_back(tx);

    auto ret = FinalizeBlock(pblock);
    return ret;
}